

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TokenStream * __thiscall Catch::Clara::Detail::TokenStream::operator++(TokenStream *this)

{
  bool bVar1;
  size_type sVar2;
  iterator __position;
  TokenStream *in_RDI;
  TokenStream *in_stack_000000a0;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  *in_stack_ffffffffffffffd0;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *this_00;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
  *in_stack_ffffffffffffffe0;
  
  sVar2 = std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          size(&in_RDI->m_tokenBuffer);
  if (sVar2 < 2) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
      ::operator++(&in_RDI->it);
    }
    loadBuffer(in_stack_000000a0);
  }
  else {
    this_00 = &in_RDI->m_tokenBuffer;
    __position = std::
                 vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
                 begin(in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::Token_const*,std::vector<Catch::Clara::Detail::Token,std::allocator<Catch::Clara::Detail::Token>>>
    ::__normal_iterator<Catch::Clara::Detail::Token*>
              ((__normal_iterator<const_Catch::Clara::Detail::Token_*,_std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>_>
                *)this_00,
               (__normal_iterator<Catch::Clara::Detail::Token_*,_std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>_>
                *)in_stack_ffffffffffffffc8);
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::erase
              (in_stack_ffffffffffffffe0,(const_iterator)__position._M_current);
  }
  return in_RDI;
}

Assistant:

TokenStream& TokenStream::operator++() {
                if ( m_tokenBuffer.size() >= 2 ) {
                    m_tokenBuffer.erase( m_tokenBuffer.begin() );
                } else {
                    if ( it != itEnd )
                        ++it;
                    loadBuffer();
                }
                return *this;
            }